

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O3

void ImageDrawPixel(Image *dst,int x,int y,Color color)

{
  int iVar1;
  void *pvVar2;
  char cVar3;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  uint uVar21;
  undefined1 auVar22 [13];
  undefined1 auVar23 [16];
  undefined1 auVar24 [14];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [14];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [14];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined3 uVar35;
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined5 uVar45;
  undefined1 auVar46 [12];
  undefined1 auVar47 [15];
  undefined1 auVar48 [12];
  undefined1 auVar49 [15];
  undefined1 auVar50 [12];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [14];
  undefined1 auVar54 [15];
  undefined1 auVar55 [14];
  undefined1 auVar56 [15];
  undefined1 auVar57 [14];
  uchar uVar58;
  ushort uVar59;
  byte bVar60;
  uint uVar61;
  byte bVar62;
  uint uVar63;
  short sVar64;
  ushort uVar65;
  float fVar67;
  float fVar69;
  float fVar70;
  int iVar71;
  float extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  undefined1 auVar75 [12];
  float extraout_XMM0_Db_03;
  float extraout_XMM0_Db_04;
  int iVar87;
  int iVar88;
  undefined1 auVar76 [12];
  ushort uVar86;
  float extraout_XMM0_Db;
  undefined1 auVar80 [16];
  float fVar68;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  int iVar89;
  byte local_68;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  undefined4 uVar66;
  undefined6 uVar72;
  undefined8 uVar73;
  undefined1 auVar74 [12];
  undefined1 auVar77 [14];
  undefined1 auVar78 [14];
  undefined1 auVar79 [14];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar85 [16];
  
  pvVar2 = dst->data;
  if (x < 0 || pvVar2 == (void *)0x0) {
    return;
  }
  iVar1 = dst->width;
  if (y < 0 || iVar1 <= x) {
    return;
  }
  if (dst->height <= y) {
    return;
  }
  if (9 < dst->format - 1U) {
    return;
  }
  uVar63 = (uint)color >> 8;
  uVar61 = (uint)color >> 0x10;
  uVar21 = (uint)color >> 0x18;
  uVar58 = color.a;
  bVar62 = color.g;
  bVar60 = color.b;
  switch(dst->format) {
  case 1:
    *(char *)((long)pvVar2 + (ulong)(uint)x + (ulong)(uint)(iVar1 * y)) =
         (char)(int)((((float)(uVar61 & 0xff) / 255.0) * 0.114 +
                     ((float)((uint)color & 0xff) / 255.0) * 0.299 +
                     ((float)(uVar63 & 0xff) / 255.0) * 0.587) * 255.0);
    break;
  case 2:
    *(char *)((long)pvVar2 + (ulong)(uint)(iVar1 * y + x) * 2) =
         (char)(int)((((float)(uVar61 & 0xff) / 255.0) * 0.114 +
                     ((float)((uint)color & 0xff) / 255.0) * 0.299 +
                     ((float)(uVar63 & 0xff) / 255.0) * 0.587) * 255.0);
    *(uchar *)((long)dst->data + (long)((y * dst->width + x) * 2) + 1) = uVar58;
    break;
  case 3:
    auVar22[0xc] = uVar58;
    auVar22._0_12_ = ZEXT712(0);
    fVar67 = roundf(((float)(uVar61 & 0xff) / 255.0) * 31.0);
    auVar23._4_4_ = (float)bVar62;
    auVar23._0_4_ = (float)((uint)color & 0xff);
    auVar23._8_4_ = (float)(int)CONCAT32(auVar22._10_3_,(ushort)bVar60);
    auVar23._12_4_ = (float)(uint3)(auVar22._10_3_ >> 0x10);
    auVar84 = divps(auVar23,_DAT_0015d8c0);
    fVar68 = roundf(auVar84._0_4_ * 31.0);
    fVar69 = roundf(auVar84._4_4_ * 63.0);
    iVar71 = (int)fVar68;
    iVar87 = (int)fVar69;
    iVar88 = (int)extraout_XMM0_Db_01;
    iVar89 = (int)extraout_XMM0_Db_02;
    sVar9 = (short)iVar71;
    cVar6 = (0 < sVar9) * (sVar9 < 0x100) * (char)iVar71 - (0xff < sVar9);
    sVar10 = (short)((uint)iVar71 >> 0x10);
    cVar5 = (char)((uint)iVar71 >> 0x10);
    sVar64 = CONCAT11((0 < sVar10) * (sVar10 < 0x100) * cVar5 - (0xff < sVar10),cVar6);
    sVar11 = (short)iVar87;
    cVar7 = (0 < sVar11) * (sVar11 < 0x100) * (char)iVar87 - (0xff < sVar11);
    sVar12 = (short)((uint)iVar87 >> 0x10);
    cVar4 = (char)((uint)iVar87 >> 0x10);
    uVar66 = CONCAT13((0 < sVar12) * (sVar12 < 0x100) * cVar4 - (0xff < sVar12),
                      CONCAT12(cVar7,sVar64));
    sVar13 = (short)iVar88;
    cVar17 = (0 < sVar13) * (sVar13 < 0x100) * (char)iVar88 - (0xff < sVar13);
    sVar14 = (short)((uint)iVar88 >> 0x10);
    cVar19 = (char)((uint)iVar88 >> 0x10);
    uVar72 = CONCAT15((0 < sVar14) * (sVar14 < 0x100) * cVar19 - (0xff < sVar14),
                      CONCAT14(cVar17,uVar66));
    sVar15 = (short)iVar89;
    cVar18 = (0 < sVar15) * (sVar15 < 0x100) * (char)iVar89 - (0xff < sVar15);
    sVar16 = (short)((uint)iVar89 >> 0x10);
    cVar20 = (char)((uint)iVar89 >> 0x10);
    uVar73 = CONCAT17((0 < sVar16) * (sVar16 < 0x100) * cVar20 - (0xff < sVar16),
                      CONCAT16(cVar18,uVar72));
    cVar8 = (0 < sVar9) * (sVar9 < 0x100) * (char)iVar71 - (0xff < sVar9);
    auVar75._0_10_ =
         CONCAT19((0 < sVar10) * (sVar10 < 0x100) * cVar5 - (0xff < sVar10),CONCAT18(cVar8,uVar73));
    cVar3 = (0 < sVar11) * (sVar11 < 0x100) * (char)iVar87 - (0xff < sVar11);
    auVar75[10] = cVar3;
    auVar75[0xb] = (0 < sVar12) * (sVar12 < 0x100) * cVar4 - (0xff < sVar12);
    cVar4 = (0 < sVar13) * (sVar13 < 0x100) * (char)iVar88 - (0xff < sVar13);
    auVar78[0xc] = cVar4;
    auVar78._0_12_ = auVar75;
    auVar78[0xd] = (0 < sVar14) * (sVar14 < 0x100) * cVar19 - (0xff < sVar14);
    cVar5 = (0 < sVar15) * (sVar15 < 0x100) * (char)iVar89 - (0xff < sVar15);
    auVar82[0xe] = cVar5;
    auVar82._0_14_ = auVar78;
    auVar82[0xf] = (0 < sVar16) * (sVar16 < 0x100) * cVar20 - (0xff < sVar16);
    sVar9 = (short)((uint)uVar66 >> 0x10);
    sVar10 = (short)((uint6)uVar72 >> 0x20);
    sVar11 = (short)((ulong)uVar73 >> 0x30);
    sVar12 = (short)((unkuint10)auVar75._0_10_ >> 0x40);
    sVar13 = auVar75._10_2_;
    sVar14 = auVar78._12_2_;
    sVar15 = auVar82._14_2_;
    cVar5 = (0 < sVar15) * (sVar15 < 0x100) * cVar5 - (0xff < sVar15);
    uVar59 = CONCAT11((0 < sVar64) * (sVar64 < 0x100) * cVar6 - (0xff < sVar64),cVar5);
    uVar35 = CONCAT12((0 < sVar9) * (sVar9 < 0x100) * cVar7 - (0xff < sVar9),uVar59);
    uVar21 = CONCAT13((0 < sVar10) * (sVar10 < 0x100) * cVar17 - (0xff < sVar10),uVar35);
    uVar45 = CONCAT14((0 < sVar11) * (sVar11 < 0x100) * cVar18 - (0xff < sVar11),uVar21);
    auVar55[5] = (0 < sVar12) * (sVar12 < 0x100) * cVar8 - (0xff < sVar12);
    auVar55._0_5_ = uVar45;
    auVar55._6_8_ = 0;
    auVar37[0xe] = cVar5;
    auVar37._0_14_ = auVar55 << 0x38;
    auVar48._4_8_ = 0;
    auVar48._0_4_ = uVar21;
    auVar49._12_3_ =
         (int3)(CONCAT26(auVar37._13_2_,
                         CONCAT15((0 < sVar14) * (sVar14 < 0x100) * cVar4 - (0xff < sVar14),uVar45))
               >> 0x28);
    auVar49._0_12_ = auVar48 << 0x38;
    auVar54._10_5_ =
         (int5)(CONCAT44(auVar49._11_4_,
                         CONCAT13((0 < sVar13) * (sVar13 < 0x100) * cVar3 - (0xff < sVar13),uVar35))
               >> 0x18);
    auVar54._0_10_ = (unkuint10)uVar59 << 0x38;
    auVar42._8_8_ = 0;
    auVar42._0_8_ =
         CONCAT62(auVar54._9_6_,
                  CONCAT11((0 < sVar12) * (sVar12 < 0x100) * cVar8 - (0xff < sVar12),cVar5)) >> 8;
    auVar31._9_7_ = 0;
    auVar31._0_9_ = SUB169(auVar42 << 0x40,7);
    auVar30._10_6_ = 0;
    auVar30._0_10_ = SUB1610(auVar31 << 0x38,6);
    auVar29._11_5_ = 0;
    auVar29._0_11_ = SUB1611(auVar30 << 0x30,5);
    auVar41._12_4_ = 0;
    auVar41._0_12_ = SUB1612(auVar29 << 0x28,4);
    auVar28._1_13_ = SUB1613(auVar41 << 0x20,3);
    auVar28[0] = (0 < sVar9) * (sVar9 < 0x100) * cVar7 - (0xff < sVar9);
    uVar65 = (ushort)(byte)((0 < sVar64) * (sVar64 < 0x100) * cVar6 - (0xff < sVar64)) * 0x800;
    uVar86 = auVar28._0_2_ * 0x20;
    uVar59 = (ushort)(int)fVar67 & 0xff;
    goto LAB_0013eff9;
  case 4:
    *(uchar *)((long)pvVar2 + (ulong)(uint)((iVar1 * y + x) * 3)) = color.r;
    *(byte *)((long)dst->data + (long)(dst->width * y + x) * 3 + 1) = bVar62;
    *(byte *)((long)dst->data + (long)(y * dst->width + x) * 3 + 2) = bVar60;
    break;
  case 5:
    fVar67 = roundf(((float)((uint)color & 0xff) / 255.0) * 31.0);
    auVar80._0_4_ = (float)(uVar63 & 0xff);
    auVar80._4_4_ = (float)bVar60;
    auVar80._8_8_ = 0;
    auVar84 = divps(auVar80,_DAT_0015d8c0);
    fVar68 = roundf(auVar84._0_4_ * 31.0);
    fVar69 = roundf(auVar84._4_4_ * 31.0);
    iVar71 = (int)fVar68;
    iVar87 = (int)fVar69;
    iVar88 = (int)extraout_XMM0_Db;
    iVar89 = (int)extraout_XMM0_Db_00;
    sVar9 = (short)iVar71;
    cVar18 = (0 < sVar9) * (sVar9 < 0x100) * (char)iVar71 - (0xff < sVar9);
    sVar10 = (short)((uint)iVar71 >> 0x10);
    cVar5 = (char)((uint)iVar71 >> 0x10);
    sVar64 = CONCAT11((0 < sVar10) * (sVar10 < 0x100) * cVar5 - (0xff < sVar10),cVar18);
    sVar11 = (short)iVar87;
    cVar8 = (0 < sVar11) * (sVar11 < 0x100) * (char)iVar87 - (0xff < sVar11);
    sVar12 = (short)((uint)iVar87 >> 0x10);
    cVar4 = (char)((uint)iVar87 >> 0x10);
    uVar66 = CONCAT13((0 < sVar12) * (sVar12 < 0x100) * cVar4 - (0xff < sVar12),
                      CONCAT12(cVar8,sVar64));
    sVar13 = (short)iVar88;
    cVar7 = (0 < sVar13) * (sVar13 < 0x100) * (char)iVar88 - (0xff < sVar13);
    sVar14 = (short)((uint)iVar88 >> 0x10);
    cVar3 = (char)((uint)iVar88 >> 0x10);
    uVar72 = CONCAT15((0 < sVar14) * (sVar14 < 0x100) * cVar3 - (0xff < sVar14),
                      CONCAT14(cVar7,uVar66));
    sVar15 = (short)iVar89;
    cVar6 = (0 < sVar15) * (sVar15 < 0x100) * (char)iVar89 - (0xff < sVar15);
    sVar16 = (short)((uint)iVar89 >> 0x10);
    cVar19 = (char)((uint)iVar89 >> 0x10);
    uVar73 = CONCAT17((0 < sVar16) * (sVar16 < 0x100) * cVar19 - (0xff < sVar16),
                      CONCAT16(cVar6,uVar72));
    cVar17 = (0 < sVar9) * (sVar9 < 0x100) * (char)iVar71 - (0xff < sVar9);
    auVar74._0_10_ =
         CONCAT19((0 < sVar10) * (sVar10 < 0x100) * cVar5 - (0xff < sVar10),CONCAT18(cVar17,uVar73))
    ;
    cVar5 = (0 < sVar11) * (sVar11 < 0x100) * (char)iVar87 - (0xff < sVar11);
    auVar74[10] = cVar5;
    auVar74[0xb] = (0 < sVar12) * (sVar12 < 0x100) * cVar4 - (0xff < sVar12);
    cVar4 = (0 < sVar13) * (sVar13 < 0x100) * (char)iVar88 - (0xff < sVar13);
    auVar77[0xc] = cVar4;
    auVar77._0_12_ = auVar74;
    auVar77[0xd] = (0 < sVar14) * (sVar14 < 0x100) * cVar3 - (0xff < sVar14);
    cVar3 = (0 < sVar15) * (sVar15 < 0x100) * (char)iVar89 - (0xff < sVar15);
    auVar81[0xe] = cVar3;
    auVar81._0_14_ = auVar77;
    auVar81[0xf] = (0 < sVar16) * (sVar16 < 0x100) * cVar19 - (0xff < sVar16);
    sVar9 = (short)((uint)uVar66 >> 0x10);
    sVar10 = (short)((uint6)uVar72 >> 0x20);
    sVar11 = (short)((ulong)uVar73 >> 0x30);
    sVar12 = (short)((unkuint10)auVar74._0_10_ >> 0x40);
    sVar13 = auVar74._10_2_;
    sVar14 = auVar77._12_2_;
    sVar15 = auVar81._14_2_;
    cVar3 = (0 < sVar15) * (sVar15 < 0x100) * cVar3 - (0xff < sVar15);
    uVar59 = CONCAT11((0 < sVar64) * (sVar64 < 0x100) * cVar18 - (0xff < sVar64),cVar3);
    uVar35 = CONCAT12((0 < sVar9) * (sVar9 < 0x100) * cVar8 - (0xff < sVar9),uVar59);
    uVar61 = CONCAT13((0 < sVar10) * (sVar10 < 0x100) * cVar7 - (0xff < sVar10),uVar35);
    uVar45 = CONCAT14((0 < sVar11) * (sVar11 < 0x100) * cVar6 - (0xff < sVar11),uVar61);
    auVar53[5] = (0 < sVar12) * (sVar12 < 0x100) * cVar17 - (0xff < sVar12);
    auVar53._0_5_ = uVar45;
    auVar53._6_8_ = 0;
    auVar36[0xe] = cVar3;
    auVar36._0_14_ = auVar53 << 0x38;
    auVar46._4_8_ = 0;
    auVar46._0_4_ = uVar61;
    auVar47._12_3_ =
         (int3)(CONCAT26(auVar36._13_2_,
                         CONCAT15((0 < sVar14) * (sVar14 < 0x100) * cVar4 - (0xff < sVar14),uVar45))
               >> 0x28);
    auVar47._0_12_ = auVar46 << 0x38;
    auVar52._10_5_ =
         (int5)(CONCAT44(auVar47._11_4_,
                         CONCAT13((0 < sVar13) * (sVar13 < 0x100) * cVar5 - (0xff < sVar13),uVar35))
               >> 0x18);
    auVar52._0_10_ = (unkuint10)uVar59 << 0x38;
    auVar40._8_8_ = 0;
    auVar40._0_8_ =
         CONCAT62(auVar52._9_6_,
                  CONCAT11((0 < sVar12) * (sVar12 < 0x100) * cVar17 - (0xff < sVar12),cVar3)) >> 8;
    auVar27._9_7_ = 0;
    auVar27._0_9_ = SUB169(auVar40 << 0x40,7);
    auVar26._10_6_ = 0;
    auVar26._0_10_ = SUB1610(auVar27 << 0x38,6);
    auVar25._11_5_ = 0;
    auVar25._0_11_ = SUB1611(auVar26 << 0x30,5);
    auVar39._12_4_ = 0;
    auVar39._0_12_ = SUB1612(auVar25 << 0x28,4);
    auVar24._1_13_ = SUB1613(auVar39 << 0x20,3);
    auVar24[0] = (0 < sVar9) * (sVar9 < 0x100) * cVar8 - (0xff < sVar9);
    *(ushort *)((long)pvVar2 + (ulong)(uint)(iVar1 * y + x) * 2) =
         auVar24._0_2_ * 2 |
         (ushort)(byte)((0 < sVar64) * (sVar64 < 0x100) * cVar18 - (0xff < sVar64)) * 0x40 |
         (ushort)(0.19607843 < (float)uVar21 / 255.0) + (short)((int)fVar67 << 0xb);
    break;
  case 6:
    fVar67 = roundf(((float)((uint)color & 0xff) / 255.0) * 15.0);
    fVar68 = roundf(((float)uVar21 / 255.0) * 15.0);
    auVar83._0_4_ = (float)(uVar63 & 0xff);
    auVar83._4_4_ = (float)bVar60;
    auVar83._8_8_ = 0;
    auVar84 = divps(auVar83,_DAT_0015d8c0);
    fVar69 = roundf(auVar84._0_4_ * 15.0);
    fVar70 = roundf(auVar84._4_4_ * 15.0);
    iVar71 = (int)fVar69;
    iVar87 = (int)fVar70;
    iVar88 = (int)extraout_XMM0_Db_03;
    iVar89 = (int)extraout_XMM0_Db_04;
    sVar9 = (short)iVar71;
    cVar3 = (0 < sVar9) * (sVar9 < 0x100) * (char)iVar71 - (0xff < sVar9);
    sVar10 = (short)((uint)iVar71 >> 0x10);
    cVar17 = (char)((uint)iVar71 >> 0x10);
    sVar64 = CONCAT11((0 < sVar10) * (sVar10 < 0x100) * cVar17 - (0xff < sVar10),cVar3);
    sVar11 = (short)iVar87;
    cVar4 = (0 < sVar11) * (sVar11 < 0x100) * (char)iVar87 - (0xff < sVar11);
    sVar12 = (short)((uint)iVar87 >> 0x10);
    cVar18 = (char)((uint)iVar87 >> 0x10);
    uVar66 = CONCAT13((0 < sVar12) * (sVar12 < 0x100) * cVar18 - (0xff < sVar12),
                      CONCAT12(cVar4,sVar64));
    sVar13 = (short)iVar88;
    cVar5 = (0 < sVar13) * (sVar13 < 0x100) * (char)iVar88 - (0xff < sVar13);
    sVar14 = (short)((uint)iVar88 >> 0x10);
    cVar19 = (char)((uint)iVar88 >> 0x10);
    uVar72 = CONCAT15((0 < sVar14) * (sVar14 < 0x100) * cVar19 - (0xff < sVar14),
                      CONCAT14(cVar5,uVar66));
    sVar15 = (short)iVar89;
    cVar6 = (0 < sVar15) * (sVar15 < 0x100) * (char)iVar89 - (0xff < sVar15);
    sVar16 = (short)((uint)iVar89 >> 0x10);
    cVar20 = (char)((uint)iVar89 >> 0x10);
    uVar73 = CONCAT17((0 < sVar16) * (sVar16 < 0x100) * cVar20 - (0xff < sVar16),
                      CONCAT16(cVar6,uVar72));
    cVar7 = (0 < sVar9) * (sVar9 < 0x100) * (char)iVar71 - (0xff < sVar9);
    auVar76._0_10_ =
         CONCAT19((0 < sVar10) * (sVar10 < 0x100) * cVar17 - (0xff < sVar10),CONCAT18(cVar7,uVar73))
    ;
    cVar8 = (0 < sVar11) * (sVar11 < 0x100) * (char)iVar87 - (0xff < sVar11);
    auVar76[10] = cVar8;
    auVar76[0xb] = (0 < sVar12) * (sVar12 < 0x100) * cVar18 - (0xff < sVar12);
    cVar18 = (0 < sVar13) * (sVar13 < 0x100) * (char)iVar88 - (0xff < sVar13);
    auVar79[0xc] = cVar18;
    auVar79._0_12_ = auVar76;
    auVar79[0xd] = (0 < sVar14) * (sVar14 < 0x100) * cVar19 - (0xff < sVar14);
    cVar17 = (0 < sVar15) * (sVar15 < 0x100) * (char)iVar89 - (0xff < sVar15);
    auVar85[0xe] = cVar17;
    auVar85._0_14_ = auVar79;
    auVar85[0xf] = (0 < sVar16) * (sVar16 < 0x100) * cVar20 - (0xff < sVar16);
    sVar9 = (short)((uint)uVar66 >> 0x10);
    sVar10 = (short)((uint6)uVar72 >> 0x20);
    sVar11 = (short)((ulong)uVar73 >> 0x30);
    sVar12 = (short)((unkuint10)auVar76._0_10_ >> 0x40);
    sVar13 = auVar76._10_2_;
    sVar14 = auVar79._12_2_;
    sVar15 = auVar85._14_2_;
    cVar17 = (0 < sVar15) * (sVar15 < 0x100) * cVar17 - (0xff < sVar15);
    uVar59 = CONCAT11((0 < sVar64) * (sVar64 < 0x100) * cVar3 - (0xff < sVar64),cVar17);
    uVar35 = CONCAT12((0 < sVar9) * (sVar9 < 0x100) * cVar4 - (0xff < sVar9),uVar59);
    uVar21 = CONCAT13((0 < sVar10) * (sVar10 < 0x100) * cVar5 - (0xff < sVar10),uVar35);
    uVar45 = CONCAT14((0 < sVar11) * (sVar11 < 0x100) * cVar6 - (0xff < sVar11),uVar21);
    auVar57[5] = (0 < sVar12) * (sVar12 < 0x100) * cVar7 - (0xff < sVar12);
    auVar57._0_5_ = uVar45;
    auVar57._6_8_ = 0;
    auVar38[0xe] = cVar17;
    auVar38._0_14_ = auVar57 << 0x38;
    auVar50._4_8_ = 0;
    auVar50._0_4_ = uVar21;
    auVar51._12_3_ =
         (int3)(CONCAT26(auVar38._13_2_,
                         CONCAT15((0 < sVar14) * (sVar14 < 0x100) * cVar18 - (0xff < sVar14),uVar45)
                        ) >> 0x28);
    auVar51._0_12_ = auVar50 << 0x38;
    auVar56._10_5_ =
         (int5)(CONCAT44(auVar51._11_4_,
                         CONCAT13((0 < sVar13) * (sVar13 < 0x100) * cVar8 - (0xff < sVar13),uVar35))
               >> 0x18);
    auVar56._0_10_ = (unkuint10)uVar59 << 0x38;
    auVar44._8_8_ = 0;
    auVar44._0_8_ =
         CONCAT62(auVar56._9_6_,
                  CONCAT11((0 < sVar12) * (sVar12 < 0x100) * cVar7 - (0xff < sVar12),cVar17)) >> 8;
    auVar34._9_7_ = 0;
    auVar34._0_9_ = SUB169(auVar44 << 0x40,7);
    auVar33._10_6_ = 0;
    auVar33._0_10_ = SUB1610(auVar34 << 0x38,6);
    auVar84._11_5_ = 0;
    auVar84._0_11_ = SUB1611(auVar33 << 0x30,5);
    auVar43._12_4_ = 0;
    auVar43._0_12_ = SUB1612(auVar84 << 0x28,4);
    auVar32._1_13_ = SUB1613(auVar43 << 0x20,3);
    auVar32[0] = (0 < sVar9) * (sVar9 < 0x100) * cVar4 - (0xff < sVar9);
    uVar65 = (ushort)(byte)((0 < sVar64) * (sVar64 < 0x100) * cVar3 - (0xff < sVar64)) * 0x100;
    uVar86 = auVar32._0_2_ * 0x10;
    local_68 = (byte)(int)fVar68;
    uVar59 = (ushort)local_68 + (short)((int)fVar67 << 0xc);
LAB_0013eff9:
    *(ushort *)((long)pvVar2 + (ulong)(uint)(iVar1 * y + x) * 2) = uVar86 | uVar65 | uVar59;
    break;
  case 7:
    *(uchar *)((long)pvVar2 + (ulong)(uint)((iVar1 * y + x) * 4)) = color.r;
    *(byte *)((long)dst->data + (long)((dst->width * y + x) * 4) + 1) = bVar62;
    *(byte *)((long)dst->data + (long)((dst->width * y + x) * 4) + 2) = bVar60;
    *(uchar *)((long)dst->data + (long)((y * dst->width + x) * 4) + 3) = uVar58;
    break;
  case 8:
    *(float *)((long)pvVar2 + (ulong)(uint)(iVar1 * y + x) * 4) =
         ((float)(uVar61 & 0xff) / 255.0) * 0.114 +
         ((float)((uint)color & 0xff) / 255.0) * 0.299 + ((float)(uVar63 & 0xff) / 255.0) * 0.587;
    break;
  case 9:
    *(float *)((long)pvVar2 + (ulong)(uint)((iVar1 * y + x) * 3) * 4) =
         (float)((uint)color & 0xff) / 255.0;
    *(float *)((long)dst->data + (long)((dst->width * y + x) * 3) * 4 + 4) =
         (float)(uVar63 & 0xff) / 255.0;
    *(float *)((long)dst->data + (long)((y * dst->width + x) * 3) * 4 + 8) =
         (float)(uVar61 & 0xff) / 255.0;
    break;
  case 10:
    *(float *)((long)pvVar2 + (ulong)(uint)((iVar1 * y + x) * 4) * 4) =
         (float)((uint)color & 0xff) / 255.0;
    *(float *)((long)dst->data + (long)((dst->width * y + x) * 4 + 1) * 4) =
         (float)(uVar63 & 0xff) / 255.0;
    *(float *)((long)dst->data + (long)((dst->width * y + x) * 4 + 2) * 4) =
         (float)(uVar61 & 0xff) / 255.0;
    *(float *)((long)dst->data + (long)((y * dst->width + x) * 4 + 3) * 4) = (float)uVar21 / 255.0;
  }
  return;
}

Assistant:

void ImageDrawPixel(Image *dst, int x, int y, Color color)
{
    // Security check to avoid program crash
    if ((dst->data == NULL) || (x < 0) || (x >= dst->width) || (y < 0) || (y >= dst->height)) return;

    switch (dst->format)
    {
        case PIXELFORMAT_UNCOMPRESSED_GRAYSCALE:
        {
            // NOTE: Calculate grayscale equivalent color
            Vector3 coln = { (float)color.r/255.0f, (float)color.g/255.0f, (float)color.b/255.0f };
            unsigned char gray = (unsigned char)((coln.x*0.299f + coln.y*0.587f + coln.z*0.114f)*255.0f);

            ((unsigned char *)dst->data)[y*dst->width + x] = gray;

        } break;
        case PIXELFORMAT_UNCOMPRESSED_GRAY_ALPHA:
        {
            // NOTE: Calculate grayscale equivalent color
            Vector3 coln = { (float)color.r/255.0f, (float)color.g/255.0f, (float)color.b/255.0f };
            unsigned char gray = (unsigned char)((coln.x*0.299f + coln.y*0.587f + coln.z*0.114f)*255.0f);

            ((unsigned char *)dst->data)[(y*dst->width + x)*2] = gray;
            ((unsigned char *)dst->data)[(y*dst->width + x)*2 + 1] = color.a;

        } break;
        case PIXELFORMAT_UNCOMPRESSED_R5G6B5:
        {
            // NOTE: Calculate R5G6B5 equivalent color
            Vector3 coln = { (float)color.r/255.0f, (float)color.g/255.0f, (float)color.b/255.0f };

            unsigned char r = (unsigned char)(round(coln.x*31.0f));
            unsigned char g = (unsigned char)(round(coln.y*63.0f));
            unsigned char b = (unsigned char)(round(coln.z*31.0f));

            ((unsigned short *)dst->data)[y*dst->width + x] = (unsigned short)r << 11 | (unsigned short)g << 5 | (unsigned short)b;

        } break;
        case PIXELFORMAT_UNCOMPRESSED_R5G5B5A1:
        {
            // NOTE: Calculate R5G5B5A1 equivalent color
            Vector4 coln = { (float)color.r/255.0f, (float)color.g/255.0f, (float)color.b/255.0f, (float)color.a/255.0f };

            unsigned char r = (unsigned char)(round(coln.x*31.0f));
            unsigned char g = (unsigned char)(round(coln.y*31.0f));
            unsigned char b = (unsigned char)(round(coln.z*31.0f));
            unsigned char a = (coln.w > ((float)PIXELFORMAT_UNCOMPRESSED_R5G5B5A1_ALPHA_THRESHOLD/255.0f))? 1 : 0;;

            ((unsigned short *)dst->data)[y*dst->width + x] = (unsigned short)r << 11 | (unsigned short)g << 6 | (unsigned short)b << 1 | (unsigned short)a;

        } break;
        case PIXELFORMAT_UNCOMPRESSED_R4G4B4A4:
        {
            // NOTE: Calculate R5G5B5A1 equivalent color
            Vector4 coln = { (float)color.r/255.0f, (float)color.g/255.0f, (float)color.b/255.0f, (float)color.a/255.0f };

            unsigned char r = (unsigned char)(round(coln.x*15.0f));
            unsigned char g = (unsigned char)(round(coln.y*15.0f));
            unsigned char b = (unsigned char)(round(coln.z*15.0f));
            unsigned char a = (unsigned char)(round(coln.w*15.0f));

            ((unsigned short *)dst->data)[y*dst->width + x] = (unsigned short)r << 12 | (unsigned short)g << 8 | (unsigned short)b << 4 | (unsigned short)a;

        } break;
        case PIXELFORMAT_UNCOMPRESSED_R8G8B8:
        {
            ((unsigned char *)dst->data)[(y*dst->width + x)*3] = color.r;
            ((unsigned char *)dst->data)[(y*dst->width + x)*3 + 1] = color.g;
            ((unsigned char *)dst->data)[(y*dst->width + x)*3 + 2] = color.b;

        } break;
        case PIXELFORMAT_UNCOMPRESSED_R8G8B8A8:
        {
            ((unsigned char *)dst->data)[(y*dst->width + x)*4] = color.r;
            ((unsigned char *)dst->data)[(y*dst->width + x)*4 + 1] = color.g;
            ((unsigned char *)dst->data)[(y*dst->width + x)*4 + 2] = color.b;
            ((unsigned char *)dst->data)[(y*dst->width + x)*4 + 3] = color.a;

        } break;
        case PIXELFORMAT_UNCOMPRESSED_R32:
        {
            // NOTE: Calculate grayscale equivalent color (normalized to 32bit)
            Vector3 coln = { (float)color.r/255.0f, (float)color.g/255.0f, (float)color.b/255.0f };

            ((float *)dst->data)[y*dst->width + x] = coln.x*0.299f + coln.y*0.587f + coln.z*0.114f;

        } break;
        case PIXELFORMAT_UNCOMPRESSED_R32G32B32:
        {
            // NOTE: Calculate R32G32B32 equivalent color (normalized to 32bit)
            Vector3 coln = { (float)color.r/255.0f, (float)color.g/255.0f, (float)color.b/255.0f };

            ((float *)dst->data)[(y*dst->width + x)*3] = coln.x;
            ((float *)dst->data)[(y*dst->width + x)*3 + 1] = coln.y;
            ((float *)dst->data)[(y*dst->width + x)*3 + 2] = coln.z;
        } break;
        case PIXELFORMAT_UNCOMPRESSED_R32G32B32A32:
        {
            // NOTE: Calculate R32G32B32A32 equivalent color (normalized to 32bit)
            Vector4 coln = { (float)color.r/255.0f, (float)color.g/255.0f, (float)color.b/255.0f, (float)color.a/255.0f };

            ((float *)dst->data)[(y*dst->width + x)*4] = coln.x;
            ((float *)dst->data)[(y*dst->width + x)*4 + 1] = coln.y;
            ((float *)dst->data)[(y*dst->width + x)*4 + 2] = coln.z;
            ((float *)dst->data)[(y*dst->width + x)*4 + 3] = coln.w;

        } break;
        default: break;
    }
}